

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodFactory.hpp
# Opt level: O1

void __thiscall OpenMD::RNEMD::MethodFactory::MethodFactory(MethodFactory *this,string *methodStr)

{
  pointer pcVar1;
  size_type sVar2;
  
  pcVar1 = (methodStr->_M_dataplus)._M_p;
  sVar2 = methodStr->_M_string_length;
  (this->methodStr_)._M_dataplus._M_p = (pointer)&(this->methodStr_).field_2;
  std::__cxx11::basic_string<char,OpenMD::Utils::ci_char_traits,std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,OpenMD::Utils::ci_char_traits,std::allocator<char>> *)this,pcVar1,
             pcVar1 + sVar2);
  return;
}

Assistant:

explicit MethodFactory(const std::string& methodStr) :
        methodStr_ {Utils::traits_cast<Utils::ci_char_traits>(methodStr)} {}